

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvim.cpp
# Opt level: O1

void __thiscall nvim::Nvim::win_set_config(Nvim *this,Window window,Dictionary *config)

{
  string local_78;
  Window local_58;
  variant<_cf2d41c5_> local_50;
  
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  local_58 = window;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"nvim_win_set_config","");
  NvimRPC::
  do_call<long,std::multimap<msgpack::v1::type::basic_variant<std::__cxx11::string,std::vector<char,std::allocator<char>>,msgpack::v1::type::ext>,msgpack::v1::type::basic_variant<std::__cxx11::string,std::vector<char,std::allocator<char>>,msgpack::v1::type::ext>,std::less<msgpack::v1::type::basic_variant<std::__cxx11::string,std::vector<char,std::allocator<char>>,msgpack::v1::type::ext>>,std::allocator<std::pair<msgpack::v1::type::basic_variant<std::__cxx11::string,std::vector<char,std::allocator<char>>,msgpack::v1::type::ext>const,msgpack::v1::type::basic_variant<std::__cxx11::string,std::vector<char,std::allocator<char>>,msgpack::v1::type::ext>>>>>
            ((Object *)&local_50,&this->client_,&local_78,&local_58,config);
  boost::variant<$cf2d41c5$>::destroy_content(&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void Nvim::win_set_config(Window window, const Dictionary& config) {
    client_.call("nvim_win_set_config", nullptr, window, config);
}